

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O2

void __thiscall
glcts::ShaderTextureImageSamplesTestBase::executeFunctionalTest
          (ShaderTextureImageSamplesTestBase *this,_sampler_type *sampler_type,_test_type *test_type
          )

{
  ostringstream *this_00;
  GLuint *pGVar1;
  _sampler_type _Var2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  ulong uVar6;
  undefined4 extraout_var;
  GLint *pGVar8;
  int *value;
  MessageBuilder *this_01;
  TestError *pTVar9;
  char *msg;
  undefined4 uVar10;
  long lVar11;
  undefined4 local_294;
  string sampler_type_string;
  string cs_body;
  string samples_modifier_token_value;
  string sampler_type_token_value;
  string sampler_type_token;
  string samples_modifier_token;
  int max_image_samples;
  ostringstream local_1a8 [376];
  long lVar7;
  
  cs_body._M_dataplus._M_p = (pointer)&cs_body.field_2;
  cs_body._M_string_length = 0;
  cs_body.field_2._M_local_buf[0] = '\0';
  deinitProgramAndShaderObjects(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&samples_modifier_token,"SAMPLES_MODIFIER",
             (allocator<char> *)&max_image_samples);
  samples_modifier_token_value._M_dataplus._M_p = (pointer)&samples_modifier_token_value.field_2;
  samples_modifier_token_value._M_string_length = 0;
  samples_modifier_token_value.field_2._M_local_buf[0] = '\0';
  sampler_type_string._M_dataplus._M_p = (pointer)&sampler_type_string.field_2;
  sampler_type_string._M_string_length = 0;
  sampler_type_string.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sampler_type_token,"SAMPLER_TYPE",(allocator<char> *)&max_image_samples);
  sampler_type_token_value._M_dataplus._M_p = (pointer)&sampler_type_token_value.field_2;
  sampler_type_token_value._M_string_length = 0;
  sampler_type_token_value.field_2._M_local_buf[0] = '\0';
  if (*test_type == TEST_TYPE_IMAGE) {
    std::__cxx11::string::assign((char *)&samples_modifier_token_value);
    switch(*sampler_type) {
    case SAMPLER_TYPE_ISAMPLER2DMS:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    case SAMPLER_TYPE_SAMPLER2DMS:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    case SAMPLER_TYPE_SAMPLER2DMSARRAY:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    case SAMPLER_TYPE_USAMPLER2DMS:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    case SAMPLER_TYPE_USAMPLER2DMSARRAY:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    default:
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Unrecognized sampler type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x140);
      goto LAB_00abf24e;
    }
  }
  else {
    if (*test_type != TEST_TYPE_TEXTURE) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Unrecognized test type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x188);
      goto LAB_00abf24e;
    }
    std::__cxx11::string::assign((char *)&samples_modifier_token_value);
    switch(*sampler_type) {
    case SAMPLER_TYPE_ISAMPLER2DMS:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    case SAMPLER_TYPE_SAMPLER2DMS:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    case SAMPLER_TYPE_SAMPLER2DMSARRAY:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    case SAMPLER_TYPE_USAMPLER2DMS:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    case SAMPLER_TYPE_USAMPLER2DMSARRAY:
      std::__cxx11::string::assign((char *)&sampler_type_string);
      break;
    default:
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Unrecognized sampler type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x17f);
      goto LAB_00abf24e;
    }
  }
  std::__cxx11::string::assign((char *)&sampler_type_token_value);
  std::__cxx11::string::assign((char *)&cs_body);
  while (uVar6 = std::__cxx11::string::find((string *)&cs_body,(ulong)&samples_modifier_token),
        uVar6 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)&cs_body,uVar6,(string *)samples_modifier_token._M_string_length);
  }
  while (uVar6 = std::__cxx11::string::find((string *)&cs_body,(ulong)&sampler_type_token),
        uVar6 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)&cs_body,uVar6,(string *)sampler_type_token._M_string_length);
  }
  bVar3 = buildComputeProgram(this,cs_body._M_dataplus._M_p,true,true);
  if (bVar3) {
    iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var,iVar4);
    (**(code **)(lVar7 + 0x12c0))(this->m_po_id,0,0);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glShaderStorageBlockBinding() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0x1a4);
    (**(code **)(lVar7 + 0x48))(0x90d2,0,this->m_bo_id);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindBufferBase() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0x1a8);
    _Var2 = *sampler_type;
    local_294 = 0x8d7c;
    if ((ulong)_Var2 < 4) {
      local_294 = *(undefined4 *)(&DAT_016fd754 + (ulong)_Var2 * 4);
    }
    if ((_Var2 < SAMPLER_TYPE_USAMPLER2DMSARRAY) && ((0x15U >> (_Var2 & 0x1f) & 1) != 0)) {
      uVar10 = 0x9100;
      bVar3 = true;
    }
    else {
      uVar10 = 0x9102;
      bVar3 = false;
    }
    (**(code **)(lVar7 + 0x880))(uVar10,local_294,0x9380,1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetInternalformativ() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0x1ca);
    iVar4 = this->m_internalformat_n_samples_count;
    if ((long)iVar4 < 1) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,
                 "Invalid value returned by glGetInternalformativ() for a GL_NUM_SAMPLE_COUNTS query"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x1ce);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pGVar8 = (GLint *)operator_new__((long)iVar4 * 4);
    this->m_internalformat_n_samples_data = pGVar8;
    (**(code **)(lVar7 + 0x880))(uVar10,local_294,0x80a9,iVar4,pGVar8);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetInternalformativ() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0x1d5);
    pGVar1 = &this->m_to_id;
    lVar11 = 0;
    do {
      if (this->m_internalformat_n_samples_count <= lVar11) {
        std::__cxx11::string::~string((string *)&sampler_type_token_value);
        std::__cxx11::string::~string((string *)&sampler_type_token);
        std::__cxx11::string::~string((string *)&sampler_type_string);
        std::__cxx11::string::~string((string *)&samples_modifier_token_value);
        std::__cxx11::string::~string((string *)&samples_modifier_token);
        std::__cxx11::string::~string((string *)&cs_body);
        return;
      }
      if (*test_type == TEST_TYPE_IMAGE) {
        (**(code **)(lVar7 + 0x868))(0x906d,&max_image_samples);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGetIntegerv(GL_MAX_IMAGE_SAMPLES) call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x1e3);
        if (this->m_internalformat_n_samples_data[lVar11] <= max_image_samples) goto LAB_00abee49;
      }
      else {
LAB_00abee49:
        (**(code **)(lVar7 + 0x6f8))(1,pGVar1);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGenTextures() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x1ea);
        (**(code **)(lVar7 + 0xb8))(uVar10,*pGVar1);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glBindTexture() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x1ed);
        if (bVar3) {
          (**(code **)(lVar7 + 0x1390))
                    (0x9100,this->m_internalformat_n_samples_data[lVar11],local_294,this->m_to_width
                     ,this->m_to_height,0);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          iVar4 = 499;
          msg = "glTexStorage2DMultisample() call failed";
        }
        else {
          (**(code **)(lVar7 + 0x13a8))
                    (uVar10,this->m_internalformat_n_samples_data[lVar11],local_294,this->m_to_width
                     ,this->m_to_height,this->m_to_depth,1);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          iVar4 = 0x1fb;
          msg = "glTexStorage3DMultisample() call failed";
        }
        glu::checkError(dVar5,msg,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,iVar4);
        if (*test_type == TEST_TYPE_IMAGE) {
          (**(code **)(lVar7 + 0x80))(0,*pGVar1,0,0,0,35000,local_294);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glBindImageTexture() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                          ,0x206);
        }
        (**(code **)(lVar7 + 0x1680))(this->m_po_id);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glUseProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x20b);
        (**(code **)(lVar7 + 0x528))(1,1,1);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glDispatchCompute() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x210);
        (**(code **)(lVar7 + 0xdb8))(0x200);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glMemoryBarrier() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x213);
        value = (int *)(**(code **)(lVar7 + 0xcf8))(0x8892,35000);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glMapBuffer() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x219);
        iVar4 = this->m_internalformat_n_samples_data[lVar11];
        if (*value != iVar4) {
          _max_image_samples =
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,"Value reported for the ");
          std::operator<<((ostream *)local_1a8,(string *)&sampler_type_string);
          std::operator<<((ostream *)local_1a8," test [");
          this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)&max_image_samples,value);
          this_00 = &this_01->m_str;
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          "]  is different from the expected one [");
          std::ostream::operator<<(this_00,iVar4);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"].");
          tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"Invalid value reported by ES SL function",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                     ,0x224);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (**(code **)(lVar7 + 0x1670))(0x8892);
        (**(code **)(lVar7 + 0x480))(1,pGVar1);
        *pGVar1 = 0;
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glDeleteTextures() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x22c);
      }
      lVar11 = lVar11 + 1;
    } while( true );
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,"Could not link a test program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
             ,0x19c);
LAB_00abf24e:
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderTextureImageSamplesTestBase::executeFunctionalTest(const _sampler_type& sampler_type,
															  const _test_type&	test_type)
{
	std::string cs_body;
	const char* cs_template_code = "#version 430\n"
								   "\n"
								   "#extension GL_ARB_shader_texture_image_samples : require\n"
								   "\n"
								   "layout(local_size_x = 1) in;\n"
								   "\n"
								   "buffer Result\n"
								   "{\n"
								   "    int samples;\n"
								   "};\n"
								   "\n"
								   "SAMPLER_TYPE data;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    samples = SAMPLES_MODIFIER\n"
								   "}\n";

	/* Any program or shader objects lying around at this point? If so, release them
	 * before we proceed.
	 */
	deinitProgramAndShaderObjects();

	/* Construct the shader body */
	const std::string samples_modifier_token		  = "SAMPLES_MODIFIER";
	size_t			  samples_modifier_token_location = std::string::npos;
	std::string		  samples_modifier_token_value;
	std::string		  sampler_type_string;
	const std::string sampler_type_token		  = "SAMPLER_TYPE";
	size_t			  sampler_type_token_location = std::string::npos;
	std::string		  sampler_type_token_value;

	switch (test_type)
	{
	case TEST_TYPE_IMAGE:
	{
		samples_modifier_token_value = "imageSamples(data);\n";

		switch (sampler_type)
		{
		case SAMPLER_TYPE_ISAMPLER2DMS:
		{
			sampler_type_string		 = "iimage2DMS";
			sampler_type_token_value = "layout(rgba8i) uniform iimage2DMS";

			break;
		}

		case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "iimage2DMSArray";
			sampler_type_token_value = "layout(rgba8i) uniform iimage2DMSArray";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMS:
		{
			sampler_type_string		 = "image2DMS";
			sampler_type_token_value = "layout(rgba8) uniform image2DMS";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "image2DMSArray";
			sampler_type_token_value = "layout(rgba8) uniform image2DMSArray";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMS:
		{
			sampler_type_string		 = "uimage2DMS";
			sampler_type_token_value = "layout(rgba8ui) uniform uimage2DMS";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "uimage2DMSArray";
			sampler_type_token_value = "layout(rgba8ui) uniform uimage2DMSArray";

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized sampler type");
		}
		} /* switch (sampler_type) */

		break;
	} /* case TEST_TYPE_IMAGE: */

	case TEST_TYPE_TEXTURE:
	{
		samples_modifier_token_value = "textureSamples(data);\n";

		switch (sampler_type)
		{
		case SAMPLER_TYPE_ISAMPLER2DMS:
		{
			sampler_type_string		 = "isampler2DMS";
			sampler_type_token_value = "uniform isampler2DMS";

			break;
		}

		case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "isampler2DMSArray";
			sampler_type_token_value = "uniform isampler2DMSArray";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMS:
		{
			sampler_type_string		 = "sampler2DMS";
			sampler_type_token_value = "uniform sampler2DMS";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "sampler2DMSArray";
			sampler_type_token_value = "uniform sampler2DMSArray";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMS:
		{
			sampler_type_string		 = "usampler2DMS";
			sampler_type_token_value = "uniform usampler2DMS";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "usampler2DMSArray";
			sampler_type_token_value = "uniform usampler2DMSArray";

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized sampler type");
		}
		} /* switch (sampler_type) */

		break;
	} /* case TEST_TYPE_TEXTURE: */

	default:
	{
		TCU_FAIL("Unrecognized test type");
	}
	} /* switch (test_type) */

	cs_body = cs_template_code;

	while ((samples_modifier_token_location = cs_body.find(samples_modifier_token)) != std::string::npos)
	{
		cs_body.replace(samples_modifier_token_location, samples_modifier_token.length(), samples_modifier_token_value);
	}

	while ((sampler_type_token_location = cs_body.find(sampler_type_token)) != std::string::npos)
	{
		cs_body.replace(sampler_type_token_location, sampler_type_token.length(), sampler_type_token_value);
	}

	/* Build the compute program */
	if (!buildComputeProgram(cs_body.c_str(), true, /* should_link_po */
							 true))					/* should_succeed */
	{
		TCU_FAIL("Could not link a test program");
	}

	/* Set up SSBO */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.shaderStorageBlockBinding(m_po_id, 0, /* storageBlockIndex */
								 0);		 /* storageBlockBinding */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderStorageBlockBinding() call failed.");

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, /* index */
					  m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	/* Determine what numbers of samples we can use for GL_RGBA8, GL_RGBA8I
	 * or GL_RGBA8UI internalformats. Specific choice depends on the sampler type
	 * requested bty the caller.
	 */
	glw::GLenum texture_internalformat = GL_NONE;
	glw::GLenum texture_target		   = GL_NONE;

	if (sampler_type == SAMPLER_TYPE_ISAMPLER2DMS || sampler_type == SAMPLER_TYPE_ISAMPLER2DMSARRAY)
	{
		texture_internalformat = GL_RGBA8I;
	}
	else if (sampler_type == SAMPLER_TYPE_SAMPLER2DMS || sampler_type == SAMPLER_TYPE_SAMPLER2DMSARRAY)
	{
		texture_internalformat = GL_RGBA8;
	}
	else
	{
		texture_internalformat = GL_RGBA8UI;
	}

	if (sampler_type == SAMPLER_TYPE_ISAMPLER2DMS || sampler_type == SAMPLER_TYPE_SAMPLER2DMS ||
		sampler_type == SAMPLER_TYPE_USAMPLER2DMS)
	{
		texture_target = GL_TEXTURE_2D_MULTISAMPLE;
	}
	else
	{
		texture_target = GL_TEXTURE_2D_MULTISAMPLE_ARRAY;
	}

	gl.getInternalformativ(texture_target, texture_internalformat, GL_NUM_SAMPLE_COUNTS, 1, /* bufSize */
						   &m_internalformat_n_samples_count);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() call failed.");

	if (m_internalformat_n_samples_count < 1)
	{
		TCU_FAIL("Invalid value returned by glGetInternalformativ() for a GL_NUM_SAMPLE_COUNTS query");
	}

	m_internalformat_n_samples_data = new glw::GLint[m_internalformat_n_samples_count];

	gl.getInternalformativ(texture_target, texture_internalformat, GL_SAMPLES, m_internalformat_n_samples_count,
						   m_internalformat_n_samples_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() call failed.");

	/* Iterate over all sample counts. For each iteration, set up texture storage,
	 * run one work-item which will store the value retrieved by one of the two new
	 * ES SL functions into the buffer object. Once that happens, map the buffer
	 * object storage contents into process space and validate the value */
	for (int n_value = 0; n_value < m_internalformat_n_samples_count; ++n_value)
	{
		if (test_type == TEST_TYPE_IMAGE)
		{
			/* Shader images do not necessarily support all sample counts. */
			int max_image_samples;

			gl.getIntegerv(GL_MAX_IMAGE_SAMPLES, &max_image_samples);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_MAX_IMAGE_SAMPLES) call failed.");

			if (m_internalformat_n_samples_data[n_value] > max_image_samples)
				continue;
		}

		gl.genTextures(1, &m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

		gl.bindTexture(texture_target, m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		if (texture_target == GL_TEXTURE_2D_MULTISAMPLE)
		{
			gl.texStorage2DMultisample(texture_target, m_internalformat_n_samples_data[n_value], texture_internalformat,
									   m_to_width, m_to_height, GL_FALSE); /* fixedsamplelocations */
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample() call failed");
		}
		else
		{
			DE_ASSERT(texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

			gl.texStorage3DMultisample(texture_target, m_internalformat_n_samples_data[n_value], texture_internalformat,
									   m_to_width, m_to_height, m_to_depth, GL_TRUE); /* fixedsamplelocations */
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3DMultisample() call failed");
		}

		/* If we're running the "image" test, bind the texture to zeroth image unit */
		if (test_type == TEST_TYPE_IMAGE)
		{
			gl.bindImageTexture(0,			/* unit */
								m_to_id, 0, /* level */
								GL_FALSE,   /* layered */
								0,			/* lyer */
								GL_READ_ONLY, texture_internalformat);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture() call failed.");
		}

		/* Dispatch a compute request */
		gl.useProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.dispatchCompute(1,  /* num_groups_x */
						   1,  /* num_groups_y */
						   1); /* num_groups_z */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() call failed.");

		gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier() call failed.");

		/* Map the buffer object storage into process space */
		const void* bo_ptr		   = gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_ONLY);
		glw::GLint  expected_value = 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed");

		expected_value = m_internalformat_n_samples_data[n_value];

		if (*(int*)bo_ptr != expected_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Value reported for the " << sampler_type_string << " test ["
							   << *(int*)bo_ptr << "] "
												   " is different from the expected one ["
							   << expected_value << "]." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by ES SL function");
		}

		/* Safe to unmap the BO at this point */
		gl.unmapBuffer(GL_ARRAY_BUFFER);

		gl.deleteTextures(1, &m_to_id);
		m_to_id = 0;
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");
	} /* for (all "n samples" values) */
}